

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_pathinfo(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  jx9_value *pjVar7;
  jx9_value *pVal;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  char *zString;
  uint uVar12;
  int iLen;
  uint local_54;
  uint local_50;
  char *local_40;
  int local_34;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar6 = jx9_value_to_string(*apArg,&local_34);
    lVar8 = (long)local_34;
    if (0 < lVar8) {
      if ((local_34 == 1) && (*pcVar6 == '/')) {
        local_40 = "/";
        uVar4 = 1;
        zString = (char *)0x0;
      }
      else {
        pcVar10 = pcVar6 + lVar8;
        do {
          pcVar9 = pcVar10 + -1;
          zString = pcVar6;
          if (pcVar9 <= pcVar6) break;
          zString = pcVar10;
          pcVar10 = pcVar9;
        } while (*pcVar9 != '/');
        uVar11 = (long)zString - (long)pcVar6;
        uVar12 = (uint)uVar11;
        local_40 = pcVar6;
        if (uVar12 < 2) {
          uVar4 = 1;
          if (*pcVar6 != '/') {
            uVar4 = uVar12;
          }
          local_40 = "/";
          if (*pcVar6 != '/') {
            local_40 = pcVar6;
          }
        }
        else {
          cVar1 = pcVar6[uVar12 - 1];
          uVar4 = uVar12;
          uVar2 = (ulong)(uVar12 - 1);
          while (cVar1 == '/') {
            if (uVar2 == 0) {
              uVar4 = 0;
              break;
            }
            uVar4 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar4;
            cVar1 = pcVar6[uVar2 - 1];
            uVar2 = uVar2 - 1;
          }
        }
        for (uVar12 = ((int)pcVar6 + local_34) - (int)zString; uVar12 != 0; uVar12 = uVar12 - 1) {
          if (*zString != '/') {
            local_50 = 0;
            uVar3 = 0;
            pcVar6 = pcVar6 + lVar8;
            goto LAB_0013b608;
          }
          zString = zString + 1;
        }
      }
      local_50 = 0;
      uVar12 = 0;
      pcVar10 = (char *)0x0;
      local_54 = 0;
      goto LAB_0013b42d;
    }
  }
  pjVar7 = pCtx->pRet;
  goto LAB_0013b364;
  while (uVar3 = uVar5 + 1, *pcVar6 != '.') {
LAB_0013b608:
    pcVar10 = pcVar6;
    uVar5 = uVar3;
    pcVar6 = pcVar10 + -1;
    local_54 = uVar12;
    if (pcVar6 <= zString) {
      pcVar10 = (char *)0x0;
      goto LAB_0013b42d;
    }
  }
  local_50 = uVar5;
  if (uVar5 < uVar12) {
    local_54 = uVar12 - (uVar5 + 1);
  }
LAB_0013b42d:
  if ((nArg == 1) || (pjVar7 = apArg[1], (pjVar7->iFlags & 2) == 0)) {
    pjVar7 = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    if (pjVar7 != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      if (uVar4 != 0) {
        jx9_value_string(pVal,local_40,uVar4);
        jx9_array_add_strkey_elem(pjVar7,"dirname",pVal);
      }
      (pVal->sBlob).nByte = 0;
      uVar4 = (pVal->sBlob).nFlags;
      if ((uVar4 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar4 = uVar4 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar4;
      }
      if (uVar12 != 0) {
        jx9_value_string(pVal,zString,uVar12);
        jx9_array_add_strkey_elem(pjVar7,"basename",pVal);
        uVar4 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar4 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        uVar4 = uVar4 & 0xfffffffb;
        (pVal->sBlob).nFlags = uVar4;
      }
      if (local_50 != 0) {
        jx9_value_string(pVal,pcVar10,local_50);
        jx9_array_add_strkey_elem(pjVar7,"extension",pVal);
        uVar4 = (pVal->sBlob).nFlags;
      }
      (pVal->sBlob).nByte = 0;
      if ((uVar4 & 4) != 0) {
        (pVal->sBlob).pBlob = (void *)0x0;
        (pVal->sBlob).mByte = 0;
        (pVal->sBlob).nFlags = uVar4 & 0xfffffffb;
      }
      if (local_54 != 0) {
        jx9_value_string(pVal,zString,local_54);
        jx9_array_add_strkey_elem(pjVar7,"filename",pVal);
      }
      jx9_result_value(pCtx,pjVar7);
      return 0;
    }
    pjVar7 = pCtx->pRet;
    jx9MemObjRelease(pjVar7);
    (pjVar7->x).rVal = 0.0;
    pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
    return 0;
  }
  jx9MemObjToInteger(pjVar7);
  switch(*(undefined4 *)&pjVar7->x) {
  case 1:
    pjVar7 = pCtx->pRet;
    pcVar10 = local_40;
    local_54 = uVar4;
    break;
  case 2:
    pjVar7 = pCtx->pRet;
    pcVar10 = zString;
    local_54 = uVar12;
    break;
  case 3:
    pjVar7 = pCtx->pRet;
    local_54 = local_50;
    break;
  case 4:
    pjVar7 = pCtx->pRet;
    pcVar10 = zString;
    break;
  default:
    pjVar7 = pCtx->pRet;
    goto LAB_0013b364;
  }
  if (local_54 != 0) goto LAB_0013b36d;
LAB_0013b364:
  pcVar10 = "";
  local_54 = 0;
LAB_0013b36d:
  jx9_value_string(pjVar7,pcVar10,local_54);
  return 0;
}

Assistant:

static int jx9Builtin_pathinfo(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	path_info sInfo;
	SyString *pComp;
	int iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract path info */
	ExtractPathInfo(zPath, iLen, &sInfo);
	if( nArg > 1 && jx9_value_is_int(apArg[1]) ){
		/* Return path component */
		int nComp = jx9_value_to_int(apArg[1]);
		switch(nComp){
		case 1: /* PATHINFO_DIRNAME */
			pComp = &sInfo.sDir;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 2: /*PATHINFO_BASENAME*/
			pComp = &sInfo.sBasename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 3: /*PATHINFO_EXTENSION*/
			pComp = &sInfo.sExtension;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 4: /*PATHINFO_FILENAME*/
			pComp = &sInfo.sFilename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		default:
			/* Expand the empty string */
			jx9_result_string(pCtx, "", 0);
			break;
		}
	}else{
		/* Return an associative array */
		jx9_value *pArray, *pValue;
		pArray = jx9_context_new_array(pCtx);
		pValue = jx9_context_new_scalar(pCtx);
		if( pArray == 0 || pValue == 0 ){
			/* Out of mem, return NULL */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* dirname */
		pComp = &sInfo.sDir;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "dirname", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* basername */
		pComp = &sInfo.sBasename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "basename", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* extension */
		pComp = &sInfo.sExtension;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "extension", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* filename */
		pComp = &sInfo.sFilename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "filename", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* Don't worry about freeing memory, everything will be released
		 * automatically as soon we return from this foreign function.
		 */
	}
	return JX9_OK;
}